

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_common.c
# Opt level: O2

int loop_restoration_row_worker(void *arg1,void *arg2)

{
  int iVar1;
  int iVar2;
  undefined8 *puVar3;
  pthread_mutex_t *__mutex;
  int *piVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  code *on_sync_read;
  int iVar8;
  int iVar9;
  undefined8 *puVar10;
  code *on_sync_write;
  int r;
  RestorationTileLimits local_40;
  
  puVar3 = *(undefined8 **)((long)arg2 + 0x10);
  __mutex = *(pthread_mutex_t **)((long)arg1 + 0x58);
  iVar6 = _setjmp((__jmp_buf_tag *)((long)arg2 + 0xf8));
  if (iVar6 == 0) {
    *(undefined4 *)((long)arg2 + 0xf0) = 1;
LAB_0033a8bc:
    pthread_mutex_lock(*(pthread_mutex_t **)((long)arg1 + 0x58));
    if (*(char *)((long)arg1 + 0x78) == '\0') {
      iVar6 = *(int *)((long)arg1 + 0x74);
      if (*(int *)((long)arg1 + 0x70) <= iVar6) goto LAB_0033a8e5;
      puVar10 = (undefined8 *)((long)iVar6 * 0x1c + *(long *)((long)arg1 + 0x68));
      *(int *)((long)arg1 + 0x74) = iVar6 + 1;
    }
    else {
LAB_0033a8e5:
      puVar10 = (undefined8 *)0x0;
    }
    pthread_mutex_unlock(*(pthread_mutex_t **)((long)arg1 + 0x58));
    if (puVar10 != (undefined8 *)0x0) {
      local_40._8_8_ = *puVar10;
      on_sync_read = lr_sync_read;
      if (*(int *)(puVar10 + 2) != 1) {
        on_sync_read = av1_lr_sync_read_dummy;
      }
      iVar6 = *(int *)((long)puVar10 + 0xc);
      lVar7 = (long)iVar6;
      iVar1 = *(int *)(puVar3 + lVar7 * 7 + 3);
      on_sync_write = lr_sync_write;
      if (*(int *)(puVar10 + 2) != 0) {
        on_sync_write = av1_lr_sync_write_dummy;
      }
      lVar5 = puVar3[lVar7 * 7 + 1];
      av1_foreach_rest_unit_in_row
                (&local_40,iVar1,(rest_unit_visitor_t)*puVar3,*(int *)(puVar10 + 1),
                 *(int *)(lVar5 + 4),*(int *)(lVar5 + 0x10),*(int *)(lVar5 + 0xc),iVar6,
                 puVar3 + lVar7 * 7 + 1,*arg2,*(RestorationLineBuffers **)((long)arg2 + 8),
                 on_sync_read,on_sync_write,(AV1LrSyncData *)arg1,
                 (aom_internal_error_info *)((long)arg2 + 0x20));
      (*loop_restoration_row_worker::copy_funs[lVar7])
                ((YV12_BUFFER_CONFIG *)puVar3[0x17],(YV12_BUFFER_CONFIG *)puVar3[0x16],0,iVar1,
                 *(int *)((long)puVar10 + 0x14),*(int *)(puVar10 + 3));
      if (*(int *)((long)arg2 + 0x18) != 0) {
        aom_extend_frame_borders_plane_row_c
                  ((YV12_BUFFER_CONFIG *)puVar3[0x16],iVar6,*(int *)((long)puVar10 + 0x14),
                   *(int *)(puVar10 + 3));
      }
      goto LAB_0033a8bc;
    }
    *(undefined4 *)((long)arg2 + 0xf0) = 0;
    iVar6 = 1;
  }
  else {
    *(undefined4 *)((long)arg2 + 0xf0) = 0;
    pthread_mutex_lock(__mutex);
    *(undefined1 *)((long)arg1 + 0x78) = 1;
    pthread_mutex_unlock(__mutex);
    for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
      piVar4 = (int *)puVar3[lVar7 * 7 + 1];
      if (*piVar4 != 0) {
        iVar6 = piVar4[1];
        iVar1 = piVar4[4];
        iVar2 = *(int *)((long)puVar3 + lVar7 * 0x38 + 0x1c);
        iVar9 = 0;
        r = iVar9;
        while( true ) {
          iVar8 = iVar2 - iVar9;
          if (iVar8 == 0 || iVar2 < iVar9) break;
          if ((iVar6 * 3) / 2 <= iVar8) {
            iVar8 = iVar6;
          }
          lr_sync_write(arg1,r,iVar1 + -1,iVar1,(int)lVar7);
          iVar9 = iVar8 + iVar9;
          r = r + 1;
        }
      }
    }
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

static int loop_restoration_row_worker(void *arg1, void *arg2) {
  AV1LrSync *const lr_sync = (AV1LrSync *)arg1;
  LRWorkerData *lrworkerdata = (LRWorkerData *)arg2;
  AV1LrStruct *lr_ctxt = (AV1LrStruct *)lrworkerdata->lr_ctxt;
  FilterFrameCtxt *ctxt = lr_ctxt->ctxt;
  int lr_unit_row;
  int plane;
  int plane_w;
#if CONFIG_MULTITHREAD
  pthread_mutex_t *job_mutex_ = lr_sync->job_mutex;
#endif
  struct aom_internal_error_info *const error_info = &lrworkerdata->error_info;

  // The jmp_buf is valid only for the duration of the function that calls
  // setjmp(). Therefore, this function must reset the 'setjmp' field to 0
  // before it returns.
  if (setjmp(error_info->jmp)) {
    error_info->setjmp = 0;
#if CONFIG_MULTITHREAD
    pthread_mutex_lock(job_mutex_);
    lr_sync->lr_mt_exit = true;
    pthread_mutex_unlock(job_mutex_);
#endif
    // In case of loop restoration multithreading, the worker on an even lr
    // block row waits for the completion of the filtering of the top-right and
    // bottom-right blocks. Hence, in case a thread (main/worker) encounters an
    // error, update that filtering of every row in the frame is complete in
    // order to avoid the dependent workers from waiting indefinitely.
    set_loop_restoration_done(lr_sync, lr_ctxt->ctxt);
    return 0;
  }
  error_info->setjmp = 1;

  typedef void (*copy_fun)(const YV12_BUFFER_CONFIG *src_ybc,
                           YV12_BUFFER_CONFIG *dst_ybc, int hstart, int hend,
                           int vstart, int vend);
  static const copy_fun copy_funs[MAX_MB_PLANE] = {
    aom_yv12_partial_coloc_copy_y, aom_yv12_partial_coloc_copy_u,
    aom_yv12_partial_coloc_copy_v
  };

  while (1) {
    AV1LrMTInfo *cur_job_info = get_lr_job_info(lr_sync);
    if (cur_job_info != NULL) {
      RestorationTileLimits limits;
      sync_read_fn_t on_sync_read;
      sync_write_fn_t on_sync_write;
      limits.v_start = cur_job_info->v_start;
      limits.v_end = cur_job_info->v_end;
      lr_unit_row = cur_job_info->lr_unit_row;
      plane = cur_job_info->plane;
      plane_w = ctxt[plane].plane_w;

      // sync_mode == 1 implies only sync read is required in LR Multi-threading
      // sync_mode == 0 implies only sync write is required.
      on_sync_read =
          cur_job_info->sync_mode == 1 ? lr_sync_read : av1_lr_sync_read_dummy;
      on_sync_write = cur_job_info->sync_mode == 0 ? lr_sync_write
                                                   : av1_lr_sync_write_dummy;

      av1_foreach_rest_unit_in_row(
          &limits, plane_w, lr_ctxt->on_rest_unit, lr_unit_row,
          ctxt[plane].rsi->restoration_unit_size, ctxt[plane].rsi->horz_units,
          ctxt[plane].rsi->vert_units, plane, &ctxt[plane],
          lrworkerdata->rst_tmpbuf, lrworkerdata->rlbs, on_sync_read,
          on_sync_write, lr_sync, error_info);

      copy_funs[plane](lr_ctxt->dst, lr_ctxt->frame, 0, plane_w,
                       cur_job_info->v_copy_start, cur_job_info->v_copy_end);

      if (lrworkerdata->do_extend_border) {
        aom_extend_frame_borders_plane_row(lr_ctxt->frame, plane,
                                           cur_job_info->v_copy_start,
                                           cur_job_info->v_copy_end);
      }
    } else {
      break;
    }
  }
  error_info->setjmp = 0;
  return 1;
}